

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialTxInReference::ConfidentialTxInReference(ConfidentialTxInReference *this)

{
  Txid local_190;
  ConfidentialTxIn local_170;
  
  Txid::Txid(&local_190);
  ConfidentialTxIn::ConfidentialTxIn(&local_170,&local_190,0,0);
  ConfidentialTxInReference(this,&local_170);
  ConfidentialTxIn::~ConfidentialTxIn(&local_170);
  Txid::~Txid(&local_190);
  return;
}

Assistant:

ConfidentialTxInReference::ConfidentialTxInReference()
    : ConfidentialTxInReference(ConfidentialTxIn(Txid(), 0, 0)) {
  // do nothing
}